

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode.c
# Opt level: O0

int CVodeSVtolerances(void *cvode_mem,sunrealtype reltol,N_Vector abstol)

{
  N_Vector p_Var1;
  long in_RSI;
  CVodeMem in_RDI;
  double in_XMM0_Qa;
  double dVar2;
  sunrealtype atolmin;
  CVodeMem cv_mem;
  int local_4;
  
  if (in_RDI == (CVodeMem)0x0) {
    cvProcessError((CVodeMem)0x0,-0x15,0x2cd,"CVodeSVtolerances",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode.c"
                   ,"cvode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else if (in_RDI->cv_MallocDone == 0) {
    cvProcessError(in_RDI,-0x17,0x2d4,"CVodeSVtolerances",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode.c"
                   ,"Attempt to call before CVodeInit.");
    local_4 = -0x17;
  }
  else if (0.0 <= in_XMM0_Qa) {
    if (*(long *)(*(long *)(in_RSI + 8) + 0xb8) == 0) {
      cvProcessError(in_RDI,-0x16,0x2e4,"CVodeSVtolerances",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode.c"
                     ,"Missing N_VMin routine from N_Vector");
      local_4 = -0x16;
    }
    else {
      dVar2 = (double)N_VMin(in_RSI);
      if (0.0 <= dVar2) {
        if (in_RDI->cv_VabstolMallocDone == 0) {
          p_Var1 = (N_Vector)N_VClone(in_RDI->cv_ewt);
          in_RDI->cv_Vabstol = p_Var1;
          in_RDI->cv_lrw = in_RDI->cv_lrw1 + in_RDI->cv_lrw;
          in_RDI->cv_liw = in_RDI->cv_liw1 + in_RDI->cv_liw;
          in_RDI->cv_VabstolMallocDone = 1;
        }
        in_RDI->cv_reltol = in_XMM0_Qa;
        N_VScale(0x3ff0000000000000,in_RSI,in_RDI->cv_Vabstol);
        in_RDI->cv_atolmin0 = (uint)(dVar2 == 0.0);
        in_RDI->cv_itol = 2;
        in_RDI->cv_user_efun = 0;
        in_RDI->cv_efun = cvEwtSet;
        in_RDI->cv_e_data = (void *)0x0;
        local_4 = 0;
      }
      else {
        cvProcessError(in_RDI,-0x16,0x2eb,"CVodeSVtolerances",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode.c"
                       ,"abstol has negative component(s) (illegal).");
        local_4 = -0x16;
      }
    }
  }
  else {
    cvProcessError(in_RDI,-0x16,0x2dd,"CVodeSVtolerances",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode.c"
                   ,"reltol < 0 illegal.");
    local_4 = -0x16;
  }
  return local_4;
}

Assistant:

int CVodeSVtolerances(void* cvode_mem, sunrealtype reltol, N_Vector abstol)
{
  CVodeMem cv_mem;
  sunrealtype atolmin;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  if (cv_mem->cv_MallocDone == SUNFALSE)
  {
    cvProcessError(cv_mem, CV_NO_MALLOC, __LINE__, __func__, __FILE__,
                   MSGCV_NO_MALLOC);
    return (CV_NO_MALLOC);
  }

  /* Check inputs */

  if (reltol < ZERO)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_BAD_RELTOL);
    return (CV_ILL_INPUT);
  }

  if (abstol->ops->nvmin == NULL)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "Missing N_VMin routine from N_Vector");
    return (CV_ILL_INPUT);
  }
  atolmin = N_VMin(abstol);
  if (atolmin < ZERO)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_BAD_ABSTOL);
    return (CV_ILL_INPUT);
  }

  /* Copy tolerances into memory */

  if (!(cv_mem->cv_VabstolMallocDone))
  {
    cv_mem->cv_Vabstol = N_VClone(cv_mem->cv_ewt);
    cv_mem->cv_lrw += cv_mem->cv_lrw1;
    cv_mem->cv_liw += cv_mem->cv_liw1;
    cv_mem->cv_VabstolMallocDone = SUNTRUE;
  }

  cv_mem->cv_reltol = reltol;
  N_VScale(ONE, abstol, cv_mem->cv_Vabstol);
  cv_mem->cv_atolmin0 = (atolmin == ZERO);

  cv_mem->cv_itol = CV_SV;

  cv_mem->cv_user_efun = SUNFALSE;
  cv_mem->cv_efun      = cvEwtSet;
  cv_mem->cv_e_data    = NULL; /* will be set to cvode_mem in InitialSetup */

  return (CV_SUCCESS);
}